

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O0

ProgramData * __thiscall
deqp::gles2::Performance::anon_unknown_1::LoopInvariantCodeMotionCase::generateProgramData
          (ProgramData *__return_storage_ptr__,LoopInvariantCodeMotionCase *this,bool optimized)

{
  undefined7 in_register_00000011;
  string local_358;
  byte local_337;
  byte local_336;
  byte local_335;
  byte local_334;
  byte local_333;
  byte local_332;
  byte local_331;
  string local_330;
  byte local_30a;
  byte local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  byte local_1e2;
  byte local_1e1;
  string local_1e0;
  byte local_1bd;
  byte local_1bc;
  byte local_1bb;
  byte local_1ba;
  byte local_1b9;
  string local_1b8;
  byte local_198;
  byte local_197;
  byte local_196;
  byte local_195;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string statements;
  string precision;
  float local_20;
  int i;
  float scale;
  bool optimized_local;
  LoopInvariantCodeMotionCase *this_local;
  
  local_20 = 0.0;
  for (precision.field_2._12_4_ = 0; (int)precision.field_2._12_4_ < this->m_numLoopIterations;
      precision.field_2._12_4_ = precision.field_2._12_4_ + 1) {
    local_20 = (float)(int)precision.field_2._12_4_ * 3.2 + 4.6 + local_20;
  }
  local_20 = 1.0 / local_20;
  i._3_1_ = optimized;
  _scale = this;
  this_local = (LoopInvariantCodeMotionCase *)__return_storage_ptr__;
  Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
            ((string *)((long)&statements.field_2 + 8),
             (_anonymous_namespace_ *)(ulong)(this->super_ShaderOptimizationCase).m_caseShaderType,
             (CaseShaderType)CONCAT71(in_register_00000011,optimized));
  local_195 = 0;
  local_196 = 0;
  local_197 = 0;
  local_198 = 0;
  local_1b9 = 0;
  local_1ba = 0;
  local_1bb = 0;
  local_1bc = 0;
  local_1bd = 0;
  local_1e1 = 0;
  local_1e2 = 0;
  local_309 = 0;
  local_30a = 0;
  local_331 = 0;
  local_332 = 0;
  local_333 = 0;
  local_334 = 0;
  local_335 = 0;
  local_336 = 0;
  local_337 = 0;
  if ((i._3_1_ & 1) == 0) {
    std::operator+(&local_308,"\t",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&statements.field_2 + 8));
    local_309 = 1;
    std::operator+(&local_2e8,&local_308," vec4 valueOrig = value;\n\tfor (int i = 0; i < ");
    local_30a = 1;
    de::toString<int>(&local_330,&this->m_numLoopIterations);
    local_331 = 1;
    std::operator+(&local_2c8,&local_2e8,&local_330);
    local_332 = 1;
    std::operator+(&local_2a8,&local_2c8,"; i++)\n\t{\n\t\t");
    local_333 = 1;
    std::operator+(&local_288,&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&statements.field_2 + 8));
    local_334 = 1;
    std::operator+(&local_268,&local_288," float x = 3.2*float(i) + 4.6;\n\t\t");
    local_335 = 1;
    std::operator+(&local_248,&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&statements.field_2 + 8));
    local_336 = 1;
    std::operator+(&local_228,&local_248,
                   " vec4 y = sin(cos(sin(valueOrig)));\n\t\tvalue += x*y;\n\t}\n\tvalue *= ");
    local_337 = 1;
    de::toString<float>(&local_358,&local_20);
    std::operator+(&local_208,&local_228,&local_358);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   &local_208,";\n");
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_358);
  }
  else {
    std::operator+(&local_188,"\t",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&statements.field_2 + 8));
    local_195 = 1;
    std::operator+(&local_168,&local_188," vec4 valueOrig = value;\n\t");
    local_196 = 1;
    std::operator+(&local_148,&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&statements.field_2 + 8));
    local_197 = 1;
    std::operator+(&local_128,&local_148,
                   " vec4 y = sin(cos(sin(valueOrig)));\n\tfor (int i = 0; i < ");
    local_198 = 1;
    de::toString<int>(&local_1b8,&this->m_numLoopIterations);
    local_1b9 = 1;
    std::operator+(&local_108,&local_128,&local_1b8);
    local_1ba = 1;
    std::operator+(&local_e8,&local_108,"; i++)\n\t{\n\t\t");
    local_1bb = 1;
    std::operator+(&local_c8,&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&statements.field_2 + 8));
    local_1bc = 1;
    std::operator+(&local_a8,&local_c8,
                   " float x = 3.2*float(i) + 4.6;\n\t\tvalue += x*y;\n\t}\n\tvalue *= ");
    local_1bd = 1;
    de::toString<float>(&local_1e0,&local_20);
    local_1e1 = 1;
    std::operator+(&local_88,&local_a8,&local_1e0);
    local_1e2 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   &local_88,";\n");
  }
  if ((local_337 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_228);
  }
  if ((local_336 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_248);
  }
  if ((local_335 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_268);
  }
  if ((local_334 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_288);
  }
  if ((local_333 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  if ((local_332 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  if ((local_331 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_330);
  }
  if ((local_30a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2e8);
  }
  if ((local_309 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_308);
  }
  if ((local_1e2 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((local_1e1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  if ((local_1bd & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((local_1bc & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((local_1bb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e8);
  }
  if ((local_1ba & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_108);
  }
  if ((local_1b9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  if ((local_198 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_128);
  }
  if ((local_197 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_148);
  }
  if ((local_196 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_168);
  }
  if ((local_195 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_188);
  }
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     (string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(statements.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		float scale = 0.0f;
		for (int i = 0; i < m_numLoopIterations; i++)
			scale += 3.2f*(float)i + 4.6f;
		scale = 1.0f / scale;

		const string precision		= getShaderPrecision(m_caseShaderType);
		const string statements		= optimized ?	"	" + precision + " vec4 valueOrig = value;\n"
													"	" + precision + " vec4 y = sin(cos(sin(valueOrig)));\n"
													"	for (int i = 0; i < " + toString(m_numLoopIterations) + "; i++)\n"
													"	{\n"
													"		" + precision + " float x = 3.2*float(i) + 4.6;\n"
													"		value += x*y;\n"
													"	}\n"
													"	value *= " + toString(scale) + ";\n"

												:	"	" + precision + " vec4 valueOrig = value;\n"
													"	for (int i = 0; i < " + toString(m_numLoopIterations) + "; i++)\n"
													"	{\n"
													"		" + precision + " float x = 3.2*float(i) + 4.6;\n"
													"		" + precision + " vec4 y = sin(cos(sin(valueOrig)));\n"
													"		value += x*y;\n"
													"	}\n"
													"	value *= " + toString(scale) + ";\n";

		return defaultProgramData(m_caseShaderType, statements);
	}